

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QString * QtPrivate::QCalendarDateSectionValidator::highlightString
                    (QString *__return_storage_ptr__,QString *str,int pos)

{
  qsizetype originalLength;
  char16_t *pcVar1;
  CutResult CVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView>,_QLatin1String>
  local_80;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos == 0) {
    local_80.a.a.a.m_size = 3;
    local_80.a.a.a.m_data = L"<b>";
    local_80.a.a.b.m_data = (char *)0x4;
    local_80.a.b.m_size = 0x6d2460;
    local_80.a.a.b.m_size = (qsizetype)str;
    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::
    convertTo<QString>(__return_storage_ptr__,
                       (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>
                        *)&local_80);
  }
  else {
    originalLength = (str->d).size;
    pcVar1 = (str->d).ptr;
    pcVar4 = (char *)(long)((int)originalLength - pos);
    local_80.a.a.a.m_size = 0;
    local_40 = pcVar4;
    CVar2 = QContainerImplHelper::mid(originalLength,(qsizetype *)&local_80,(qsizetype *)&local_40);
    local_80.a.a.a.m_data = (char16_t *)0x0;
    pcVar3 = (char *)0x0;
    if (CVar2 != Null) {
      local_80.a.a.a.m_data = pcVar1 + local_80.a.a.a.m_size;
      pcVar3 = local_40;
    }
    pcVar1 = (str->d).ptr;
    local_80.a.a.a.m_size = (qsizetype)pcVar4;
    local_40 = (char *)(long)pos;
    CVar2 = QContainerImplHelper::mid((str->d).size,(qsizetype *)&local_80,(qsizetype *)&local_40);
    local_80.a.b.m_data = (char16_t *)0x0;
    local_80.a.b.m_size = (qsizetype)(char *)0x0;
    if (CVar2 != Null) {
      local_80.a.b.m_data = pcVar1 + local_80.a.a.a.m_size;
      local_80.a.b.m_size = (qsizetype)local_40;
    }
    local_80.a.a.b.m_size = 3;
    local_80.a.a.b.m_data = "<b>";
    local_80.b.m_size = 4;
    local_80.b.m_data = "</b>";
    local_80.a.a.a.m_size = (qsizetype)pcVar3;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringView,_QLatin1String>,_QStringView>,_QLatin1String>
    ::convertTo<QString>(__return_storage_ptr__,&local_80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarDateSectionValidator::highlightString(const QString &str, int pos)
{
    if (pos == 0)
        return "<b>"_L1 + str + "</b>"_L1;
    int startPos = str.size() - pos;
    return QStringView{str}.mid(0, startPos) + "<b>"_L1 + QStringView{str}.mid(startPos, pos) + "</b>"_L1;

}